

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O2

void DrawImageToBox(FTexture *tex,int x,int y,int w,int h,int trans)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  if (tex != (FTexture *)0x0) {
    auVar9._4_4_ = 0;
    auVar9._0_4_ = w;
    auVar9._8_4_ = h;
    auVar9._12_4_ = 0;
    auVar8._0_8_ = SUB168(auVar9 | _DAT_005ab380,0) - (double)DAT_005ab380;
    auVar8._8_8_ = SUB168(auVar9 | _DAT_005ab380,8) - DAT_005ab380._8_8_;
    uVar4._0_2_ = tex->Width;
    uVar4._2_2_ = tex->Height;
    uVar4._4_2_ = tex->WidthMask;
    uVar4._6_2_ = *(undefined2 *)&tex->field_0x3e;
    auVar1._8_4_ = 0;
    auVar1._0_8_ = uVar4;
    auVar1._12_2_ = uVar4._6_2_;
    auVar2._8_2_ = uVar4._4_2_;
    auVar2._0_8_ = uVar4;
    auVar2._10_4_ = auVar1._10_4_;
    auVar3._6_8_ = 0;
    auVar3._0_6_ = auVar2._8_6_;
    auVar6._0_8_ = (double)(ushort)(undefined2)uVar4;
    auVar6._8_8_ = (double)(int)CONCAT82(SUB148(auVar3 << 0x40,6),uVar4._2_2_);
    auVar6 = divpd(auVar6,(undefined1  [16])tex->Scale);
    uVar4 = -(ulong)(auVar8._0_8_ < auVar6._0_8_);
    uVar5 = -(ulong)(auVar8._8_8_ < auVar6._8_8_);
    auVar9 = divpd(auVar8,auVar6);
    dVar10 = (double)(~uVar4 & 0x3ff0000000000000 | auVar9._0_8_ & uVar4);
    dVar7 = (double)(~uVar5 & 0x3ff0000000000000 | auVar9._8_8_ & uVar5);
    if (dVar10 <= dVar7) {
      dVar7 = dVar10;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,tex,(double)(int)(((uint)w >> 1) + x),(double)(y + h),0x400013a8,1,
               0x40001399,(ulong)(uint)hudwidth,0x4000139a,(ulong)(uint)hudheight,0x4000138b,
               (ulong)(uint)trans,0x40001389,(ulong)(uint)(int)(auVar6._0_8_ * dVar7),0x4000138a,
               (ulong)(uint)(int)(auVar6._8_8_ * dVar7),0x4000139e,1,0);
  }
  return;
}

Assistant:

static void DrawImageToBox(FTexture * tex, int x, int y, int w, int h, int trans=0xc000)
{
	double scale1, scale2;

	if (tex)
	{
		double texwidth=tex->GetScaledWidthDouble();
		double texheight=tex->GetScaledHeightDouble();

		if (w<texwidth) scale1=w/texwidth;
		else scale1=1.0f;
		if (h<texheight) scale2=h/texheight;
		else scale2=1.0f;
		if (scale2<scale1) scale1=scale2;

		x+=w>>1;
		y+=h;

		w=(int)(texwidth*scale1);
		h=(int)(texheight*scale1);

		screen->DrawTexture(tex, x, y,
			DTA_KeepRatio, true,
			DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, trans, 
			DTA_DestWidth, w, DTA_DestHeight, h, DTA_CenterBottomOffset, 1, TAG_DONE);

	}
}